

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteUnwindTryCatchStack(CWriter *this,Label *label)

{
  pointer pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char (*args) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  Newline *in_R8;
  bool bVar3;
  
  pTVar1 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_start;
  args = (char (*) [16])
         ((long)(this->try_catch_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4);
  u = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ((long)args * -0x5555555555555555);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           label->try_catch_stack_size;
  bVar3 = (long)u - (long)pbVar2 == 0;
  if (u < pbVar2) {
    __assert_fail("try_catch_stack_.size() >= label->try_catch_stack_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xbdc,
                  "void wabt::(anonymous namespace)::CWriter::WriteUnwindTryCatchStack(const Label *)"
                 );
  }
  if (bVar3) {
    return;
  }
  if (u >= pbVar2 && !bVar3) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [27])(pTVar1 + (long)pbVar2),u,args,in_R8);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pbVar2);
}

Assistant:

void CWriter::WriteUnwindTryCatchStack(const Label* label) {
  assert(try_catch_stack_.size() >= label->try_catch_stack_size);

  if (try_catch_stack_.size() != label->try_catch_stack_size) {
    const std::string& name =
        try_catch_stack_.at(label->try_catch_stack_size).name;

    Write("wasm_rt_set_unwind_target(", name, "_outer_target);", Newline());
  }
}